

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O0

zip_source_t *
zip_source_winzip_aes_decode
          (zip_t *za,zip_source_t *src,zip_uint16_t encryption_method,int flags,char *password)

{
  int iVar1;
  winzip_aes *ctx_00;
  int local_8c;
  winzip_aes *ctx;
  zip_uint64_t aux_length;
  zip_stat_t st;
  zip_source_t *s2;
  char *password_local;
  int flags_local;
  zip_uint16_t encryption_method_local;
  zip_source_t *src_local;
  zip_t *za_local;
  
  if ((((encryption_method == 0x101) || (encryption_method == 0x102)) ||
      (encryption_method == 0x103)) && ((password != (char *)0x0 && (src != (zip_source_t *)0x0))))
  {
    if ((flags & 1U) == 0) {
      iVar1 = zip_source_stat(src,(zip_stat_t *)&aux_length);
      if (iVar1 == 0) {
        if (encryption_method == 0x101) {
          local_8c = 8;
        }
        else {
          local_8c = 0x10;
          if (encryption_method == 0x102) {
            local_8c = 0xc;
          }
        }
        if (((aux_length & 8) == 0) || (st.size < (ulong)(long)(local_8c + 0xc))) {
          zip_error_set(&za->error,0x1c,0);
          za_local = (zip_t *)0x0;
        }
        else {
          ctx_00 = winzip_aes_new(encryption_method,password,&za->error);
          if (ctx_00 == (winzip_aes *)0x0) {
            za_local = (zip_t *)0x0;
          }
          else {
            ctx_00->data_length = st.size - (long)(local_8c + 0xc);
            st._56_8_ = zip_source_layered(za,src,winzip_aes_decrypt,ctx_00);
            za_local = (zip_t *)st._56_8_;
            if ((zip_t *)st._56_8_ == (zip_t *)0x0) {
              winzip_aes_free(ctx_00);
              za_local = (zip_t *)0x0;
            }
          }
        }
      }
      else {
        _zip_error_set_from_source(&za->error,src);
        za_local = (zip_t *)0x0;
      }
    }
    else {
      zip_error_set(&za->error,0x18,0);
      za_local = (zip_t *)0x0;
    }
  }
  else {
    zip_error_set(&za->error,0x12,0);
    za_local = (zip_t *)0x0;
  }
  return (zip_source_t *)za_local;
}

Assistant:

zip_source_t *
zip_source_winzip_aes_decode(zip_t *za, zip_source_t *src, zip_uint16_t encryption_method, int flags, const char *password) {
    zip_source_t *s2;
    zip_stat_t st;
    zip_uint64_t aux_length;
    struct winzip_aes *ctx;

    if ((encryption_method != ZIP_EM_AES_128 && encryption_method != ZIP_EM_AES_192 && encryption_method != ZIP_EM_AES_256) || password == NULL || src == NULL) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return NULL;
    }
    if (flags & ZIP_CODEC_ENCODE) {
	zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
	return NULL;
    }

    if (zip_source_stat(src, &st) != 0) {
	_zip_error_set_from_source(&za->error, src);
	return NULL;
    }

    aux_length = WINZIP_AES_PASSWORD_VERIFY_LENGTH + SALT_LENGTH(encryption_method) + HMAC_LENGTH;

    if ((st.valid & ZIP_STAT_COMP_SIZE) == 0 || st.comp_size < aux_length) {
	zip_error_set(&za->error, ZIP_ER_OPNOTSUPP, 0);
	return NULL;
    }

    if ((ctx = winzip_aes_new(encryption_method, password, &za->error)) == NULL) {
	return NULL;
    }

    ctx->data_length = st.comp_size - aux_length;

    if ((s2 = zip_source_layered(za, src, winzip_aes_decrypt, ctx)) == NULL) {
	winzip_aes_free(ctx);
	return NULL;
    }

    return s2;
}